

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O3

bool __thiscall
Assimp::DefaultLogger::attachStream(DefaultLogger *this,LogStream *pStream,uint severity)

{
  pointer *pppLVar1;
  iterator __position;
  LogStreamInfo *pLVar2;
  LogStreamInfo **ppLVar3;
  uint uVar4;
  LogStreamInfo *pInfo;
  LogStreamInfo *local_28;
  
  if (pStream != (LogStream *)0x0) {
    uVar4 = 0xf;
    if (severity != 0) {
      uVar4 = severity;
    }
    __position._M_current =
         (this->m_StreamArray).
         super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    for (ppLVar3 = (this->m_StreamArray).
                   super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppLVar3 != __position._M_current;
        ppLVar3 = ppLVar3 + 1) {
      pLVar2 = *ppLVar3;
      if (pLVar2->m_pStream == pStream) {
        pLVar2->m_uiErrorSeverity = pLVar2->m_uiErrorSeverity | uVar4;
        goto LAB_0013c59e;
      }
    }
    local_28 = (LogStreamInfo *)operator_new(0x10);
    local_28->m_uiErrorSeverity = uVar4;
    local_28->m_pStream = pStream;
    if (__position._M_current ==
        (this->m_StreamArray).
        super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::LogStreamInfo*,std::allocator<Assimp::LogStreamInfo*>>::
      _M_realloc_insert<Assimp::LogStreamInfo*const&>
                ((vector<Assimp::LogStreamInfo*,std::allocator<Assimp::LogStreamInfo*>> *)
                 &this->m_StreamArray,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      pppLVar1 = &(this->m_StreamArray).
                  super__Vector_base<Assimp::LogStreamInfo_*,_std::allocator<Assimp::LogStreamInfo_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppLVar1 = *pppLVar1 + 1;
    }
  }
LAB_0013c59e:
  return pStream != (LogStream *)0x0;
}

Assistant:

bool DefaultLogger::attachStream( LogStream *pStream, unsigned int severity ) {
    if ( nullptr == pStream ) {
        return false;
    }

    if (0 == severity)  {
        severity = Logger::Info | Logger::Err | Logger::Warn | Logger::Debugging;
    }

    for ( StreamIt it = m_StreamArray.begin();
        it != m_StreamArray.end();
        ++it )
    {
        if ( (*it)->m_pStream == pStream ) {
            (*it)->m_uiErrorSeverity |= severity;
            return true;
        }
    }

    LogStreamInfo *pInfo = new LogStreamInfo( severity, pStream );
    m_StreamArray.push_back( pInfo );
    return true;
}